

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxx.cpp
# Opt level: O1

bool mg::data::nxx_decompress(string_view *in,string *out)

{
  char *pcVar1;
  bool bVar2;
  undefined1 auStack_18 [8];
  Nxx header;
  
  if (in->_M_len < 0x10) {
    nxx_decompress();
  }
  else {
    pcVar1 = in->_M_str;
    auStack_18 = *(undefined1 (*) [8])pcVar1;
    header._0_8_ = *(undefined8 *)(pcVar1 + 8);
    if ((char  [4])auStack_18._0_4_ == (char  [4])0x5843584e) {
      bVar2 = nxcx_decompress((Nxx *)auStack_18,(uint8_t *)(pcVar1 + 0x10),out);
      return bVar2;
    }
    if ((char  [4])auStack_18._0_4_ == (char  [4])0x5847584e) {
      bVar2 = nxgx_decompress((Nxx *)auStack_18,(uint8_t *)(pcVar1 + 0x10),out);
      return bVar2;
    }
    nxx_decompress();
  }
  return false;
}

Assistant:

bool nxx_decompress(const std::string_view &in, std::string &out) {
  // Input large enough to contain header?
  if (in.size() < sizeof(Nxx)) {
    fprintf(stderr, "NXX file too small\n");
    return false;
  }

  // Pun header
  Nxx header = *reinterpret_cast<const Nxx *>(in.data());
  header.to_host_order();

  // Check magic
  const uint8_t *data_ptr = reinterpret_cast<const uint8_t *>(&in[sizeof(Nxx)]);
  if (!strncmp(header.magic, MAGIC_NXCX, sizeof(header.magic))) {
    return nxcx_decompress(header, data_ptr, out);
  } else if (!strncmp(header.magic, MAGIC_NXGX, sizeof(header.magic))) {
    return nxgx_decompress(header, data_ptr, out);
  } else {
    fprintf(stderr, "Invalid file magic\n");
    return false;
  }
}